

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void whereLoopClearUnion(sqlite3 *db,WhereLoop *p)

{
  byte *pbVar1;
  uint uVar2;
  Index *pIVar3;
  
  uVar2 = p->wsFlags;
  if ((uVar2 & 0x4400) != 0) {
    if (((uVar2 >> 10 & 1) == 0) ||
       ((undefined1  [24])((undefined1  [24])p->u & (undefined1  [24])0x100000000) ==
        (undefined1  [24])0x0)) {
      if ((uVar2 >> 0xe & 1) == 0) {
        return;
      }
      pIVar3 = (p->u).btree.pIndex;
      if (pIVar3 == (Index *)0x0) {
        return;
      }
      sqlite3DbFree(db,pIVar3->zColAff);
      sqlite3DbFreeNN(db,(p->u).btree.pIndex);
    }
    else {
      sqlite3_free((p->u).btree.pIndex);
      pbVar1 = (byte *)((long)&p->u + 4);
      *pbVar1 = *pbVar1 & 0xfe;
    }
    (p->u).btree.pIndex = (Index *)0x0;
  }
  return;
}

Assistant:

static void whereLoopClearUnion(sqlite3 *db, WhereLoop *p){
  if( p->wsFlags & (WHERE_VIRTUALTABLE|WHERE_AUTO_INDEX) ){
    if( (p->wsFlags & WHERE_VIRTUALTABLE)!=0 && p->u.vtab.needFree ){
      sqlite3_free(p->u.vtab.idxStr);
      p->u.vtab.needFree = 0;
      p->u.vtab.idxStr = 0;
    }else if( (p->wsFlags & WHERE_AUTO_INDEX)!=0 && p->u.btree.pIndex!=0 ){
      sqlite3DbFree(db, p->u.btree.pIndex->zColAff);
      sqlite3DbFreeNN(db, p->u.btree.pIndex);
      p->u.btree.pIndex = 0;
    }
  }
}